

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dt-from-pseudo-root-dt.cpp
# Opt level: O0

Up __thiscall
yactfr::internal::DtFromPseudoRootDtConverter::
_dtFromPseudoVarType<yactfr::VariantWithUnsignedIntegerSelectorType,std::map<std::__cxx11::string,yactfr::IntegerRangeSet<unsigned_long_long,true>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::IntegerRangeSet<unsigned_long_long,true>>>>>
          (DtFromPseudoRootDtConverter *this,PseudoVarType *pseudoVarType,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>_>_>
          *selTypeMappings,DataLocation *selLoc)

{
  DataLocation *this_00;
  bool bVar1;
  ulong uVar2;
  PseudoNamedDts *pPVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  pointer pPVar6;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *poVar7
  ;
  reference_const_type pbVar8;
  ostream *poVar9;
  TextLocation *pTVar10;
  TextLocation *pTVar11;
  pointer ppVar12;
  DataLocation *in_R8;
  undefined1 local_280 [16];
  unique_ptr<const_yactfr::VariantWithUnsignedIntegerSelectorType,_std::default_delete<const_yactfr::VariantWithUnsignedIntegerSelectorType>_>
  local_270;
  key_type local_268;
  undefined1 local_260 [8];
  undefined1 local_258 [8];
  undefined1 local_250 [40];
  ostringstream local_228 [8];
  ostringstream ss;
  _Self local_b0;
  _Self local_a8;
  const_iterator rangesIt;
  value_type *pseudoOpt;
  uint local_8c;
  undefined1 local_88 [4];
  uint i;
  Options opts;
  allocator local_59;
  string local_58;
  DataLocation *local_38;
  DataLocation *selLoc_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>_>_>
  *selTypeMappings_local;
  PseudoVarType *pseudoVarType_local;
  DtFromPseudoRootDtConverter *this_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  local_38 = in_R8;
  selLoc_local = selLoc;
  selTypeMappings_local = selTypeMappings;
  pseudoVarType_local = pseudoVarType;
  this_local = this;
  bVar1 = _intTypeMappingsOverlap<std::map<std::__cxx11::string,yactfr::IntegerRangeSet<unsigned_long_long,true>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::IntegerRangeSet<unsigned_long_long,true>>>>>
                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>_>_>
                      *)selLoc);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_58,"Selector type of variant type contains overlapping mappings.",
               &local_59);
    pTVar10 = PseudoDt::loc((PseudoDt *)selTypeMappings_local);
    pTVar11 = PseudoDt::loc((PseudoDt *)selTypeMappings_local);
    _throwInvalDataLoc((DtFromPseudoRootDtConverter *)pseudoVarType,&local_58,pTVar10,local_38,
                       pTVar11);
  }
  std::
  vector<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
  ::vector((vector<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
            *)local_88);
  local_8c = 0;
  while( true ) {
    uVar2 = (ulong)local_8c;
    pPVar3 = PseudoVarType::pseudoOpts((PseudoVarType *)selTypeMappings_local);
    sVar4 = std::
            vector<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>,_std::allocator<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>_>_>
            ::size(pPVar3);
    if (sVar4 <= uVar2) {
      local_268 = (key_type)selTypeMappings_local;
      std::
      unordered_map<const_yactfr::internal::PseudoDt_*,_unsigned_long_long,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>_>
      ::erase((unordered_map<const_yactfr::internal::PseudoDt_*,_unsigned_long_long,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>_>
               *)&(pseudoVarType->super_PseudoDt)._posInScope.super_type.m_storage,&local_268);
      local_280._12_4_ = 1;
      WithAttrsMixin::attrs((WithAttrsMixin *)(selTypeMappings_local + 1));
      _tryCloneAttrs((MapItem *)local_280);
      VariantWithUnsignedIntegerSelectorType::
      create<int,std::vector<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>,std::allocator<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>>>,yactfr::DataLocation_const&,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
                ((int *)&local_270,
                 (vector<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
                  *)(local_280 + 0xc),(DataLocation *)local_88,
                 (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
                 local_38);
      std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>::
      unique_ptr<yactfr::VariantWithUnsignedIntegerSelectorType_const,std::default_delete<yactfr::VariantWithUnsignedIntegerSelectorType_const>,void>
                ((unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>> *)
                 this,&local_270);
      std::
      unique_ptr<const_yactfr::VariantWithUnsignedIntegerSelectorType,_std::default_delete<const_yactfr::VariantWithUnsignedIntegerSelectorType>_>
      ::~unique_ptr(&local_270);
      std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::
      ~unique_ptr((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
                  local_280);
      std::
      vector<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
      ::~vector((vector<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
                 *)local_88);
      return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
              )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
                )this;
    }
    uVar2 = (ulong)local_8c;
    pseudoOpt = (value_type *)selTypeMappings_local;
    pmVar5 = std::
             unordered_map<const_yactfr::internal::PseudoDt_*,_unsigned_long_long,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>_>
             ::operator[]((unordered_map<const_yactfr::internal::PseudoDt_*,_unsigned_long_long,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>_>
                           *)&(pseudoVarType->super_PseudoDt)._posInScope.super_type.m_storage,
                          (key_type *)&pseudoOpt);
    *pmVar5 = uVar2;
    pPVar3 = PseudoVarType::pseudoOpts((PseudoVarType *)selTypeMappings_local);
    rangesIt._M_node =
         (_Base_ptr)
         std::
         vector<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>,_std::allocator<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>_>_>
         ::operator[](pPVar3,(ulong)local_8c);
    pPVar6 = std::
             unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>
             ::operator->((unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>
                           *)rangesIt._M_node);
    local_10 = PseudoNamedDt::name_abi_cxx11_(pPVar6);
    bVar1 = boost::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator!(local_10);
    this_00 = selLoc_local;
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pPVar6 = std::
             unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>
             ::operator->((unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>
                           *)rangesIt._M_node);
    poVar7 = PseudoNamedDt::name_abi_cxx11_(pPVar6);
    pbVar8 = boost::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(poVar7);
    local_a8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>_>_>
                 *)this_00,pbVar8);
    local_b0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>_>_>
                *)selLoc_local);
    bVar1 = std::operator==(&local_a8,&local_b0);
    if (bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_228);
      poVar9 = std::operator<<((ostream *)local_228,
                               "Selector type of variant type has no mapping named `");
      pPVar6 = std::
               unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>
               ::operator->((unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>
                             *)rangesIt._M_node);
      poVar7 = PseudoNamedDt::name_abi_cxx11_(pPVar6);
      pbVar8 = boost::
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(poVar7);
      poVar9 = std::operator<<(poVar9,(string *)pbVar8);
      std::operator<<(poVar9,"`.");
      std::__cxx11::ostringstream::str();
      pTVar10 = PseudoDt::loc((PseudoDt *)selTypeMappings_local);
      pTVar11 = PseudoDt::loc((PseudoDt *)selTypeMappings_local);
      _throwInvalDataLoc((DtFromPseudoRootDtConverter *)pseudoVarType,(string *)(local_250 + 8),
                         pTVar10,local_38,pTVar11);
    }
    pPVar6 = std::
             unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>
             ::operator->((unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>
                           *)rangesIt._M_node);
    poVar7 = PseudoNamedDt::name_abi_cxx11_(pPVar6);
    pbVar8 = boost::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(poVar7);
    pPVar6 = std::
             unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>
             ::operator->((unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>
                           *)rangesIt._M_node);
    PseudoNamedDt::pseudoDt(pPVar6);
    _dtFromPseudoDt((DtFromPseudoRootDtConverter *)local_258,&pseudoVarType->super_PseudoDt);
    ppVar12 = std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>_>
              ::operator->(&local_a8);
    pPVar6 = std::
             unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>
             ::operator->((unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>
                           *)rangesIt._M_node);
    WithAttrsMixin::attrs(&pPVar6->super_WithAttrsMixin);
    _tryCloneAttrs((MapItem *)local_260);
    VariantTypeOption<unsigned_long_long>::
    create<std::__cxx11::string_const&,std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>,yactfr::IntegerRangeSet<unsigned_long_long,true>const&,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
               (unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> *)
               pbVar8,(IntegerRangeSet<unsigned_long_long,_true> *)local_258,
               (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               &ppVar12->second);
    std::
    vector<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
    ::push_back((vector<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
                 *)local_88,(value_type *)local_250);
    std::
    unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>
    ::~unique_ptr((unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>
                   *)local_250);
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
              ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               local_260);
    std::unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_>::
    ~unique_ptr((unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> *)
                local_258);
    local_8c = local_8c + 1;
  }
  __assert_fail("pseudoOpt->name()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/dt-from-pseudo-root-dt.cpp"
                ,0x17d,
                "DataType::Up yactfr::internal::DtFromPseudoRootDtConverter::_dtFromPseudoVarType(const PseudoVarType &, const MappingsT &, const DataLocation &) [VarTypeT = yactfr::VariantWithUnsignedIntegerSelectorType, MappingsT = std::map<std::basic_string<char>, yactfr::IntegerRangeSet<unsigned long long>>]"
               );
}

Assistant:

DataType::Up DtFromPseudoRootDtConverter::_dtFromPseudoVarType(const PseudoVarType& pseudoVarType,
                                                               const MappingsT& selTypeMappings,
                                                               const DataLocation& selLoc)
{
    // validate that the selector type has no overlapping mappings
    if (this->_intTypeMappingsOverlap(selTypeMappings)) {
        this->_throwInvalDataLoc("Selector type of variant type contains overlapping mappings.",
                                 pseudoVarType.loc(), selLoc, pseudoVarType.loc());
    }

    typename VarTypeT::Options opts;

    for (auto i = 0U; i < pseudoVarType.pseudoOpts().size(); ++i) {
        // currently being visited
        _current[&pseudoVarType] = i;

        const auto& pseudoOpt = pseudoVarType.pseudoOpts()[i];

        assert(pseudoOpt->name());

        const auto rangesIt = selTypeMappings.find(*pseudoOpt->name());

        // validate that the range set exists
        if (rangesIt == selTypeMappings.end()) {
            std::ostringstream ss;

            ss << "Selector type of variant type has no mapping named `" <<
                  *pseudoOpt->name() << "`.";
            this->_throwInvalDataLoc(ss.str(), pseudoVarType.loc(), selLoc, pseudoVarType.loc());
        }

        opts.push_back(VarTypeT::Option::create(*pseudoOpt->name(),
                                                this->_dtFromPseudoDt(pseudoOpt->pseudoDt()),
                                                rangesIt->second,
                                                this->_tryCloneAttrs(pseudoOpt->attrs())));
    }

    // not visited anymore
    _current.erase(&pseudoVarType);

    return VarTypeT::create(1, std::move(opts), selLoc,
                            this->_tryCloneAttrs(pseudoVarType.attrs()));
}